

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

int amqp_encode_bytes(amqp_bytes_t encoded,size_t *offset,amqp_bytes_t input)

{
  size_t offset_00;
  ulong uVar1;
  void *__dest;
  size_t in_RCX;
  size_t *in_RDX;
  void *in_RSI;
  ulong in_RDI;
  void *in_R8;
  size_t o;
  undefined4 local_4;
  
  offset_00 = *in_RDX;
  if (in_RCX == 0) {
    local_4 = 1;
  }
  else {
    uVar1 = offset_00 + in_RCX;
    *in_RDX = uVar1;
    if (in_RDI < uVar1) {
      local_4 = 0;
    }
    else {
      __dest = amqp_offset(in_RSI,offset_00);
      memcpy(__dest,in_R8,in_RCX);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static inline int amqp_encode_bytes(amqp_bytes_t encoded, size_t *offset,
                                    amqp_bytes_t input) {
  size_t o = *offset;
  /* The memcpy below has undefined behavior if the input is NULL. It is valid
   * for a 0-length amqp_bytes_t to have .bytes == NULL. Thus we should check
   * before encoding.
   */
  if (input.len == 0) {
    return 1;
  }
  if ((*offset = o + input.len) <= encoded.len) {
    memcpy(amqp_offset(encoded.bytes, o), input.bytes, input.len);
    return 1;
  } else {
    return 0;
  }
}